

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O3

Extra_MmFixed_t * Extra_MmFixedStart(int nEntrySize)

{
  Extra_MmFixed_t *pEVar1;
  char **ppcVar2;
  uint uVar3;
  
  pEVar1 = (Extra_MmFixed_t *)calloc(1,0x38);
  pEVar1->nEntrySize = nEntrySize;
  uVar3 = 0x400;
  if (0x3f < nEntrySize) {
    uVar3 = 8;
    if (8 < 0x10000U / (uint)nEntrySize) {
      uVar3 = 0x10000U / (uint)nEntrySize;
    }
  }
  pEVar1->nChunkSize = uVar3;
  pEVar1->nChunksAlloc = 0x40;
  pEVar1->nChunks = 0;
  ppcVar2 = (char **)malloc(0x200);
  pEVar1->pChunks = ppcVar2;
  pEVar1->nMemoryUsed = 0;
  pEVar1->nMemoryAlloc = 0;
  return pEVar1;
}

Assistant:

Extra_MmFixed_t * Extra_MmFixedStart( int nEntrySize )
{
    Extra_MmFixed_t * p;

    p = ABC_ALLOC( Extra_MmFixed_t, 1 );
    memset( p, 0, sizeof(Extra_MmFixed_t) );

    p->nEntrySize    = nEntrySize;
    p->nEntriesAlloc = 0;
    p->nEntriesUsed  = 0;
    p->pEntriesFree  = NULL;

    if ( nEntrySize * (1 << 10) < (1<<16) )
        p->nChunkSize = (1 << 10);
    else
        p->nChunkSize = (1<<16) / nEntrySize;
    if ( p->nChunkSize < 8 )
        p->nChunkSize = 8;

    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}